

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O2

void duckdb::IntegralCompressFunction<duckdb::uhugeint_t,unsigned_short>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  idx_t count;
  data_ptr_t pdVar2;
  idx_t *piVar3;
  unsigned_long *puVar4;
  long lVar5;
  unsigned_short *result_data;
  uhugeint_t *puVar6;
  optional_idx oVar7;
  reference pvVar8;
  Vector *vector;
  idx_t iVar9;
  SelectionVector *sel;
  idx_t i_1;
  idx_t i;
  idx_t iVar10;
  uhugeint_t uVar11;
  undefined1 in_stack_ffffffffffffff48;
  uhugeint_t *local_b0;
  uhugeint_t min_val;
  uhugeint_t local_98;
  unsigned_short *local_80;
  optional_idx dict_size;
  data_ptr_t pdStack_70;
  unsigned_long *local_68;
  
  pvVar8 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  min_val.lower = *(uint64_t *)pvVar8->data;
  min_val.upper = *(uint64_t *)((long)pvVar8->data + 8);
  pvVar8 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  count = args->count;
  VVar1 = pvVar8->vector_type;
  local_b0 = &min_val;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    result_data = (unsigned_short *)result->data;
    puVar6 = (uhugeint_t *)pvVar8->data;
    FlatVector::VerifyFlatVector(pvVar8);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<duckdb::uhugeint_t,unsigned_short,duckdb::UnaryLambdaWrapper,duckdb::IntegralCompressFunction<duckdb::uhugeint_t,unsigned_short>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::uhugeint_t_const&)_1_>
              (puVar6,result_data,count,&pvVar8->validity,&result->validity,&local_b0,
               (bool)in_stack_ffffffffffffff48);
  }
  else {
    if (VVar1 == DICTIONARY_VECTOR) {
      dict_size = DictionaryVector::DictionarySize(pvVar8);
      if (((dict_size.index != 0xffffffffffffffff) &&
          (iVar10 = optional_idx::GetIndex(&dict_size), iVar10 * 2 <= count)) &&
         (vector = DictionaryVector::Child(pvVar8), vector->vector_type == FLAT_VECTOR)) {
        local_80 = (unsigned_short *)result->data;
        puVar6 = (uhugeint_t *)vector->data;
        iVar10 = optional_idx::GetIndex(&dict_size);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        UnaryExecutor::
        ExecuteFlat<duckdb::uhugeint_t,unsigned_short,duckdb::UnaryLambdaWrapper,duckdb::IntegralCompressFunction<duckdb::uhugeint_t,unsigned_short>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::uhugeint_t_const&)_1_>
                  (puVar6,local_80,iVar10,&vector->validity,&result->validity,&local_b0,
                   (bool)in_stack_ffffffffffffff48);
        sel = DictionaryVector::SelVector(pvVar8);
        iVar10 = optional_idx::GetIndex(&dict_size);
        Vector::Dictionary(result,result,iVar10,sel,count);
        return;
      }
    }
    else if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      pdVar2 = result->data;
      piVar3 = (idx_t *)pvVar8->data;
      puVar4 = (pvVar8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      dict_size.index = *piVar3;
      uVar11 = uhugeint_t::operator-((uhugeint_t *)&dict_size,&min_val);
      *(short *)pdVar2 = (short)uVar11.lower;
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
    Vector::ToUnifiedFormat(pvVar8,count,(UnifiedVectorFormat *)&dict_size);
    Vector::SetVectorType(result,FLAT_VECTOR);
    oVar7 = dict_size;
    pdVar2 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_68 == (unsigned_long *)0x0) {
      for (iVar10 = 0; count != iVar10; iVar10 = iVar10 + 1) {
        lVar5 = *(long *)oVar7.index;
        iVar9 = iVar10;
        if (lVar5 != 0) {
          iVar9 = (idx_t)*(uint *)(lVar5 + iVar10 * 4);
        }
        local_98.lower = *(uint64_t *)(pdStack_70 + iVar9 * 0x10);
        local_98.upper = *(uint64_t *)((long)(pdStack_70 + iVar9 * 0x10) + 8);
        uVar11 = uhugeint_t::operator-(&local_98,&min_val);
        *(short *)(pdVar2 + iVar10 * 2) = (short)uVar11.lower;
      }
    }
    else {
      for (iVar10 = 0; count != iVar10; iVar10 = iVar10 + 1) {
        lVar5 = *(long *)oVar7.index;
        iVar9 = iVar10;
        if (lVar5 != 0) {
          iVar9 = (idx_t)*(uint *)(lVar5 + iVar10 * 4);
        }
        if ((local_68[iVar9 >> 6] >> (iVar9 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar10);
        }
        else {
          local_98.lower = *(uint64_t *)(pdStack_70 + iVar9 * 0x10);
          local_98.upper = *(uint64_t *)((long)(pdStack_70 + iVar9 * 0x10) + 8);
          uVar11 = uhugeint_t::operator-(&local_98,&min_val);
          *(short *)(pdVar2 + iVar10 * 2) = (short)uVar11.lower;
        }
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
  }
  return;
}

Assistant:

static void IntegralCompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	D_ASSERT(args.data[1].GetVectorType() == VectorType::CONSTANT_VECTOR);
	const auto min_val = ConstantVector::GetData<INPUT_TYPE>(args.data[1])[0];
	UnaryExecutor::Execute<INPUT_TYPE, RESULT_TYPE>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) {
		    return TemplatedIntegralCompress<INPUT_TYPE, RESULT_TYPE>::Operation(input, min_val);
	    },
	    FunctionErrors::CANNOT_ERROR);
}